

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void opj_image_comp_header_update(opj_image_t *p_image_header,opj_cp_v2 *p_cp)

{
  byte bVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  int iVar7;
  OPJ_UINT32 OVar8;
  uint uVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  opj_image_comp_t *poVar12;
  uint uVar13;
  
  OVar11 = p_cp->tx0;
  OVar8 = p_cp->ty0;
  OVar5 = p_image_header->x0;
  if ((int)p_image_header->x0 < (int)OVar11) {
    OVar5 = OVar11;
  }
  OVar6 = p_image_header->y0;
  if ((int)p_image_header->y0 < (int)OVar8) {
    OVar6 = OVar8;
  }
  OVar11 = p_cp->tdx * p_cp->tw + OVar11;
  if ((int)p_image_header->x1 <= (int)OVar11) {
    OVar11 = p_image_header->x1;
  }
  OVar8 = p_cp->tdy * p_cp->th + OVar8;
  if ((int)p_image_header->y1 <= (int)OVar8) {
    OVar8 = p_image_header->y1;
  }
  poVar12 = p_image_header->comps;
  uVar2 = p_image_header->numcomps;
  for (uVar13 = 0; uVar13 < uVar2; uVar13 = uVar13 + 1) {
    OVar3 = poVar12->dx;
    OVar4 = poVar12->dy;
    uVar9 = (int)((OVar5 - 1) + OVar3) / (int)OVar3;
    uVar10 = (int)((OVar6 - 1) + OVar4) / (int)OVar4;
    bVar1 = (byte)poVar12->factor;
    iVar7 = 1 << (bVar1 & 0x1f);
    poVar12->w = (int)((int)((OVar11 - 1) + OVar3) / (int)OVar3 + iVar7 + ~uVar9) >> (bVar1 & 0x1f);
    poVar12->h = (int)(iVar7 + (int)((OVar8 - 1) + OVar4) / (int)OVar4 + ~uVar10) >> (bVar1 & 0x1f);
    poVar12->x0 = uVar9;
    poVar12->y0 = uVar10;
    poVar12 = poVar12 + 1;
  }
  return;
}

Assistant:

void opj_image_comp_header_update(opj_image_t * p_image_header, const struct opj_cp_v2 * p_cp)
{
	OPJ_UINT32 i, l_width, l_height;
	OPJ_INT32 l_x0, l_y0, l_x1, l_y1;
	OPJ_INT32 l_comp_x0, l_comp_y0, l_comp_x1, l_comp_y1;
	opj_image_comp_t* l_img_comp = NULL;

	l_x0 = int_max(p_cp->tx0 , p_image_header->x0);
	l_y0 = int_max(p_cp->ty0 , p_image_header->y0);
	l_x1 = int_min(p_cp->tx0 + p_cp->tw * p_cp->tdx, p_image_header->x1);
	l_y1 = int_min(p_cp->ty0 + p_cp->th * p_cp->tdy, p_image_header->y1);

	l_img_comp = p_image_header->comps;
	for	(i = 0; i < p_image_header->numcomps; ++i) {
		l_comp_x0 = int_ceildiv(l_x0, l_img_comp->dx);
		l_comp_y0 = int_ceildiv(l_y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(l_x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(l_y1, l_img_comp->dy);
		l_width = int_ceildivpow2(l_comp_x1 - l_comp_x0, l_img_comp->factor);
		l_height = int_ceildivpow2(l_comp_y1 - l_comp_y0, l_img_comp->factor);
		l_img_comp->w = l_width;
		l_img_comp->h = l_height;
		l_img_comp->x0 = l_comp_x0/*l_x0*/;
		l_img_comp->y0 = l_comp_y0/*l_y0*/;
		++l_img_comp;
	}
}